

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O3

Maybe<capnp::StructSchema::Field> * __thiscall
capnp::StructSchema::getFieldByDiscriminant
          (Maybe<capnp::StructSchema::Field> *__return_storage_ptr__,StructSchema *this,
          uint16_t discriminant)

{
  ushort uVar1;
  bool bVar2;
  NullableValue<capnp::StructSchema::Field> *pNVar3;
  undefined6 in_register_00000012;
  FieldSubset unionFields;
  FieldSubset local_a8;
  undefined4 local_54;
  StructReader local_50;
  
  getUnionFields(&local_a8,this);
  bVar2 = (uint)CONCAT62(in_register_00000012,discriminant) < local_a8.size_;
  if (bVar2) {
    uVar1 = local_a8.indices[discriminant];
    capnp::_::ListReader::getStructElement(&local_50,&local_a8.list.reader,(uint)uVar1);
    pNVar3 = &__return_storage_ptr__->ptr;
    *(StructDataBitCount *)((long)&pNVar3->field_1 + 0x30) = local_50.dataSize;
    *(StructPointerCount *)((long)&pNVar3->field_1 + 0x34) = local_50.pointerCount;
    *(undefined2 *)((long)&pNVar3->field_1 + 0x36) = local_50._38_2_;
    *(int *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x38) = local_50.nestingLimit;
    *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x3c) = local_50._44_4_;
    (__return_storage_ptr__->ptr).field_1.value.proto._reader.data = local_50.data;
    (__return_storage_ptr__->ptr).field_1.value.proto._reader.pointers = local_50.pointers;
    (__return_storage_ptr__->ptr).field_1.value.proto._reader.segment = local_50.segment;
    (__return_storage_ptr__->ptr).field_1.value.proto._reader.capTable = local_50.capTable;
    (__return_storage_ptr__->ptr).field_1.value.parent.super_Schema.raw =
         (RawBrandedSchema *)local_a8.parent.super_Schema.raw;
    *(uint *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = (uint)uVar1;
    *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0xc) = local_54;
  }
  (__return_storage_ptr__->ptr).isSet = bVar2;
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<StructSchema::Field> StructSchema::getFieldByDiscriminant(uint16_t discriminant) const {
  auto unionFields = getUnionFields();

  if (discriminant >= unionFields.size()) {
    return nullptr;
  } else {
    return unionFields[discriminant];
  }
}